

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_text.c
# Opt level: O3

int text_nthline(int n,t_atom *vec,int line,int *startp,int *endp)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  
  if (n < 1) {
    return 0;
  }
  uVar3 = (ulong)(uint)n;
  uVar1 = 0;
  iVar4 = 0;
  while (iVar4 != line) {
    iVar4 = iVar4 + (uint)((vec->a_type & ~A_FLOAT) == A_SEMI);
    uVar1 = uVar1 + 1;
    vec = vec + 1;
    if (uVar3 == uVar1) {
      return 0;
    }
  }
  iVar4 = (int)uVar1;
  if (iVar4 < n) {
    do {
      uVar2 = uVar1;
      if ((vec->a_type & ~A_FLOAT) == A_SEMI) break;
      uVar1 = uVar1 + 1;
      vec = vec + 1;
      uVar2 = uVar3;
    } while (uVar3 != uVar1);
  }
  else {
    uVar2 = uVar1 & 0xffffffff;
  }
  *startp = iVar4;
  *endp = (int)uVar2;
  return 1;
}

Assistant:

static int text_nthline(int n, t_atom *vec, int line, int *startp, int *endp)
{
    int i, cnt = 0;
    for (i = 0; i < n; i++)
    {
        if (cnt == line)
        {
            int j = i;
            while (j < n && vec[j].a_type != A_SEMI &&
                vec[j].a_type != A_COMMA)
                    j++;
            *startp = i;
            *endp = j;
            return (1);
        }
        else if (vec[i].a_type == A_SEMI || vec[i].a_type == A_COMMA)
            cnt++;
    }
    return (0);
}